

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStruct
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  reference ppFVar2;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  FieldDef *local_b0;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_a0;
  const_iterator it;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  LobsterGenerator *this_local;
  
  if (((struct_def->super_Definition).generated & 1U) == 0) {
    local_28 = code_ptr;
    code = code_ptr;
    code_ptr_local = (string *)struct_def;
    struct_def_local = (StructDef *)this;
    CheckNameSpace(this,&struct_def->super_Definition,code_ptr);
    GenComment((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(code_ptr_local + 2),code,(CommentConfig *)0x0,"");
    NormalizedName_abi_cxx11_(&local_88,this,(Definition *)code_ptr_local);
    std::operator+(&local_68,"class ",&local_88);
    std::operator+(&local_48,&local_68," : flatbuffers.handle\n");
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    local_a0._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                    ((long)&code_ptr_local[7].field_2 + 8));
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)((long)&code_ptr_local[7].field_2 + 8));
      bVar1 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar1) break;
      ppFVar2 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_a0);
      local_b0 = *ppFVar2;
      if ((local_b0->deprecated & 1U) == 0) {
        GenStructAccessor(this,(StructDef *)code_ptr_local,local_b0,code);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_a0);
    }
    std::__cxx11::string::operator+=((string *)local_28,"\n");
    if ((code_ptr_local[8].field_2._M_local_buf[0] & 1U) == 0) {
      NormalizedName_abi_cxx11_(&local_150,this,(Definition *)code_ptr_local);
      std::operator+(&local_130,"def GetRootAs",&local_150);
      std::operator+(&local_110,&local_130,"(buf:string): return ");
      NormalizedName_abi_cxx11_(&local_170,this,(Definition *)code_ptr_local);
      std::operator+(&local_f0,&local_110,&local_170);
      std::operator+(&local_d0,&local_f0," { buf, flatbuffers.indirect(buf, 0) }\n\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
    if ((code_ptr_local[8].field_2._M_local_buf[0] & 1U) == 0) {
      GenTableBuilders(this,(StructDef *)code_ptr_local,code);
    }
    else {
      GenStructBuilder(this,(StructDef *)code_ptr_local,code);
    }
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(struct_def, &code);
    GenComment(struct_def.doc_comment, code_ptr, nullptr, "");
    code += "class " + NormalizedName(struct_def) + " : flatbuffers.handle\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      GenStructAccessor(struct_def, field, code_ptr);
    }
    code += "\n";
    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      code += "def GetRootAs" + NormalizedName(struct_def) +
              "(buf:string): return " + NormalizedName(struct_def) +
              " { buf, flatbuffers.indirect(buf, 0) }\n\n";
    }
    if (struct_def.fixed) {
      // create a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Create a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
  }